

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_JUnitOutputTest_testFailureWithNewlineInIt_TestShell::
~TEST_JUnitOutputTest_testFailureWithNewlineInIt_TestShell
          (TEST_JUnitOutputTest_testFailureWithNewlineInIt_TestShell *this)

{
  TEST_JUnitOutputTest_testFailureWithNewlineInIt_TestShell *this_local;
  
  ~TEST_JUnitOutputTest_testFailureWithNewlineInIt_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(JUnitOutputTest, testFailureWithNewlineInIt)
{
    testCaseRunner->start()
            .withGroup("testGroupWithFailingTest")
                .withTest("FailingTestName").thatFails("Test \nfailed", "thisfile", 10)
            .end();

    outputFile = fileSystem.file("cpputest_testGroupWithFailingTest.xml");

    STRCMP_EQUAL("<failure message=\"thisfile:10: Test {newline}failed\" type=\"AssertionFailedError\">\n", outputFile->line(6));
}